

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O2

void time_update(void)

{
  int iVar1;
  ROOM_INDEX_DATA *pRVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  char *__src;
  long lVar6;
  AREA_DATA_conflict **ppAVar7;
  char *pcVar8;
  char *pcVar9;
  DESCRIPTOR_DATA **ppDVar10;
  char bw3 [4608];
  char bw1 [4608];
  char buf [4608];
  char bw4 [4608];
  char bw2 [4608];
  char colbuf [4608];
  
  iVar3 = time_info.season;
  __src = bw3;
  buf[0] = '\0';
  builtin_strncpy(bw1,"{rA ruddy glow fills the eastern sky as dawn approaches.{x",0x3b);
  pcVar8 = "{YThe sky brightens as the great flaming disc peers above the eastern horizon.{x";
  pcVar9 = bw2;
  for (lVar6 = 0x51; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pcVar9 = *pcVar8;
    pcVar8 = pcVar8 + 1;
    pcVar9 = pcVar9 + 1;
  }
  builtin_strncpy(bw3 + 0x30,"rizon.{x",9);
  builtin_strncpy(bw3 + 0x20,"w the western ho",0x10);
  builtin_strncpy(bw3 + 0x10," disappears belo",0x10);
  builtin_strncpy(bw3,"{MThe sun slowly",0x10);
  pcVar8 = "{mThe violet glow leaves the western sky as evening gives way to night.{x";
  pcVar9 = bw4;
  for (lVar6 = 0x4a; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pcVar9 = *pcVar8;
    pcVar8 = pcVar8 + 1;
    pcVar9 = pcVar9 + 1;
  }
  if (!time_info.half) {
    time_info.half = true;
    goto LAB_003194b6;
  }
  time_info.half = false;
  iVar1 = time_info.hour;
  switch(time_info.season) {
  case 0:
    if (time_info.hour == 6) {
LAB_0031944e:
      __src = bw1;
      sun = 1;
    }
    else {
      if (time_info.hour == 0x17) {
LAB_00319440:
        time_info.hour = 0;
        time_info.day = time_info.day + 1;
        iVar1 = time_info.hour;
        break;
      }
      if (time_info.hour == 0xf) {
LAB_00319430:
        sun = 3;
      }
      else if (time_info.hour == 0x10) {
LAB_00319439:
        sun = 0;
        __src = bw4;
      }
      else {
        iVar1 = time_info.hour + 1;
        if (time_info.hour != 7) break;
LAB_0031942a:
        sun = 2;
        __src = bw2;
      }
    }
    time_info.hour = time_info.hour + 1;
    strcpy(buf,__src);
    iVar1 = time_info.hour;
    break;
  case 1:
  case 3:
    if (time_info.hour == 5) goto LAB_0031944e;
    if (time_info.hour == 0x17) goto LAB_00319440;
    if (time_info.hour == 0x11) goto LAB_00319430;
    if (time_info.hour == 0x12) goto LAB_00319439;
    iVar1 = time_info.hour + 1;
    if (time_info.hour == 6) goto LAB_0031942a;
    break;
  case 2:
    if (time_info.hour == 4) goto LAB_0031944e;
    if (time_info.hour == 0x17) goto LAB_00319440;
    if (time_info.hour == 0x13) goto LAB_00319430;
    if (time_info.hour == 0x14) goto LAB_00319439;
    iVar1 = time_info.hour + 1;
    if (time_info.hour == 5) goto LAB_0031942a;
  }
  time_info.hour = iVar1;
  if (0x1d < time_info.day) {
    time_info.day = 0;
    iVar1 = time_info.month + 1;
    iVar5 = time_info.month + 2;
    time_info.month = iVar1;
    if (iVar5 % 3 == 0) {
      time_info.season = 0;
      if (iVar3 < 3) {
        time_info.season = iVar3 + 1;
      }
    }
  }
  if (0xb < time_info.month) {
    time_info.month = 0;
    time_info.year = time_info.year + 1;
  }
LAB_003194b6:
  if (buf[0] != '\0') {
    ppDVar10 = &descriptor_list;
    while (ppDVar10 = &((DESCRIPTOR_DATA *)ppDVar10)->next->next,
          (DESCRIPTOR_DATA *)ppDVar10 != (DESCRIPTOR_DATA *)0x0) {
      if (((DESCRIPTOR_DATA *)ppDVar10)->connected == 0) {
        pRVar2 = ((DESCRIPTOR_DATA *)ppDVar10)->character->in_room;
        if (((((pRVar2 != (ROOM_INDEX_DATA *)0x0) && (pRVar2->sector_type != 8)) &&
             (bVar4 = is_outside(((DESCRIPTOR_DATA *)ppDVar10)->character), bVar4)) &&
            ((bVar4 = is_awake(((DESCRIPTOR_DATA *)ppDVar10)->character), bVar4 &&
             (bVar4 = is_editing(((DESCRIPTOR_DATA *)ppDVar10)->character), !bVar4)))) &&
           ((bVar4 = is_affected_area(((DESCRIPTOR_DATA *)ppDVar10)->character->in_room->area,
                                      (int)gsn_whiteout), !bVar4 &&
            ((bVar4 = is_affected_area(((DESCRIPTOR_DATA *)ppDVar10)->character->in_room->area,
                                       (int)gsn_cyclone), !bVar4 &&
             (bVar4 = is_affected_by(((DESCRIPTOR_DATA *)ppDVar10)->character,0), !bVar4)))))) {
          colorconv(colbuf,buf,((DESCRIPTOR_DATA *)ppDVar10)->character);
          send_to_char(colbuf,((DESCRIPTOR_DATA *)ppDVar10)->character);
          send_to_char("\n\r",((DESCRIPTOR_DATA *)ppDVar10)->character);
        }
      }
    }
    if (buf[0] != '\0') {
      ppAVar7 = &area_first;
      while (ppAVar7 = &((AREA_DATA_conflict *)ppAVar7)->next->next,
            (AREA_DATA_conflict *)ppAVar7 != (AREA_DATA_conflict *)0x0) {
        if ((((AREA_DATA_conflict *)ppAVar7)->progtypes[0] & 4) != 0) {
          (*(code *)((AREA_DATA_conflict *)ppAVar7)->aprogs->sun_prog)(ppAVar7);
        }
      }
    }
  }
  return;
}

Assistant:

void time_update(void)
{
	char buf[MSL], colbuf[MSL];
	char bw1[MSL], bw2[MSL], bw3[MSL], bw4[MSL];
	DESCRIPTOR_DATA *d;
	AREA_DATA *area;

	buf[0] = '\0';

	sprintf(bw1, "{rA ruddy glow fills the eastern sky as dawn approaches.{x");
	sprintf(bw2, "{YThe sky brightens as the great flaming disc peers above the eastern horizon.{x");
	sprintf(bw3, "{MThe sun slowly disappears below the western horizon.{x");
	sprintf(bw4, "{mThe violet glow leaves the western sky as evening gives way to night.{x");

	if (time_info.half)
	{
		time_info.half= false;

		/* Season affects sunrise/sunset! */
		switch (time_info.season)
		{
			case 0:
				switch (++time_info.hour)
				{
					case 7:
						sun = SolarPosition::Sunrise;
						sprintf(buf, "%s", bw1);
						break;
					case 8:
						sun = SolarPosition::Daylight;
						sprintf(buf, "%s", bw2);
						break;
					case 16:
						sun = SolarPosition::Sunset;
						sprintf(buf, "%s", bw3);
						break;
					case 17:
						sun = SolarPosition::Dark;
						sprintf(buf, "%s", bw4);
						break;
					case 24:
						time_info.hour = 0;
						time_info.day++;
						break;
				}

				break;
			case 1:
				switch (++time_info.hour)
				{
					case 6:
						sun = SolarPosition::Sunrise;
						sprintf(buf, "%s", bw1);
						break;
					case 7:
						sun = SolarPosition::Daylight;
						sprintf(buf, "%s", bw2);
						break;
					case 18:
						sun = SolarPosition::Sunset;
						sprintf(buf, "%s", bw3);
						break;
					case 19:
						sun = SolarPosition::Dark;
						sprintf(buf, "%s", bw4);
						break;
					case 24:
						time_info.hour = 0;
						time_info.day++;
						break;
				}

				break;
			case (2):
				switch (++time_info.hour)
				{
					case 5:
						sun = SolarPosition::Sunrise;
						sprintf(buf, "%s", bw1);
						break;
					case 6:
						sun = SolarPosition::Daylight;
						sprintf(buf, "%s", bw2);
						break;
					case 20:
						sun = SolarPosition::Sunset;
						sprintf(buf, "%s", bw3);
						break;
					case 21:
						sun = SolarPosition::Dark;
						sprintf(buf, "%s", bw4);
						break;
					case 24:
						time_info.hour = 0;
						time_info.day++;
						break;
				}

				break;
			case 3:
				switch (++time_info.hour)
				{
					case 6:
						sun = SolarPosition::Sunrise;
						sprintf(buf, "%s", bw1);
						break;
					case 7:
						sun = SolarPosition::Daylight;
						sprintf(buf, "%s", bw2);
						break;
					case 18:
						sun = SolarPosition::Sunset;
						sprintf(buf, "%s", bw3);
						break;
					case 19:
						sun = SolarPosition::Dark;
						sprintf(buf, "%s", bw4);
						break;
					case 24:
						time_info.hour = 0;
						time_info.day++;
						break;
				}

				break;
		}

		if (time_info.day >= 30)
		{
			time_info.day = 0;
			time_info.month++;

			if ((time_info.month + 1) % 3 == 0)
			{
				time_info.season++;
				if (time_info.season > 3)
					time_info.season = 0;
			}
		}

		if (time_info.month >= 12)
		{
			time_info.month = 0;
			time_info.year++;
			// update_guild_leader();
		}
	}
	else
	{
		time_info.half = true;
	}

	if (buf[0] != '\0')
	{
		for (d = descriptor_list; d != nullptr; d = d->next)
		{
			if (d->connected == CON_PLAYING
				&& d->character->in_room
				&& d->character->in_room->sector_type != SECT_UNDERWATER
				&& is_outside(d->character)
				&& is_awake(d->character)
				&& !is_editing(d->character)
				&& !(is_affected_area(d->character->in_room->area, gsn_whiteout))
				&& !(is_affected_area(d->character->in_room->area, gsn_cyclone))
				&& !(is_affected_by(d->character, AFF_BLIND)))
			{
				colorconv(colbuf, buf, d->character);
				send_to_char(colbuf, d->character);
				send_to_char("\n\r", d->character);
			}
		}
	}

	if (buf[0] != '\0')
	{
		for (area = area_first; area != nullptr; area = area->next)
		{
			if (IS_SET(area->progtypes, APROG_SUN))
				(area->aprogs->sun_prog)(area);
		}
	}
}